

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

double nk_strtod(char *str,char **endptr)

{
  char *pcVar1;
  bool bVar2;
  int local_50;
  int div;
  int pow;
  int i;
  double number;
  double value;
  char *p;
  double neg;
  double m;
  char **endptr_local;
  char *str_local;
  
  p = (char *)0x3ff0000000000000;
  number = 0.0;
  if (str == (char *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0xdc3,"double nk_strtod(const char *, char **)");
  }
  value = (double)str;
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    for (; *(char *)value == ' '; value = (double)((long)value + 1)) {
    }
    if (*(char *)value == '-') {
      p = (char *)0xbff0000000000000;
      value = (double)((long)value + 1);
    }
    while( true ) {
      bVar2 = false;
      if ((*(char *)value != '\0') && (bVar2 = false, *(char *)value != '.')) {
        bVar2 = *(char *)value != 'e';
      }
      if (!bVar2) break;
      number = number * 10.0 + (double)(*(char *)value + -0x30);
      value = (double)((long)value + 1);
    }
    if (*(char *)value == '.') {
      neg = 0.1;
      while( true ) {
        value = (double)((long)value + 1);
        bVar2 = false;
        if (*(char *)value != '\0') {
          bVar2 = *(char *)value != 'e';
        }
        if (!bVar2) break;
        number = (double)(*(char *)value + -0x30) * neg + number;
        neg = neg * 0.1;
      }
    }
    if (*(char *)value == 'e') {
      pcVar1 = (char *)((long)value + 1);
      if (*pcVar1 == '-') {
        bVar2 = true;
        value = (double)((long)value + 2);
      }
      else {
        if (*pcVar1 == '+') {
          pcVar1 = (char *)((long)value + 2);
        }
        value = (double)pcVar1;
        bVar2 = false;
      }
      local_50 = 0;
      for (; *(char *)value != '\0'; value = (double)((long)value + 1)) {
        local_50 = local_50 * 10 + *(char *)value + -0x30;
      }
      neg = 1.0;
      for (div = 0; div < local_50; div = div + 1) {
        neg = neg * 10.0;
      }
      if (bVar2) {
        number = number / neg;
      }
      else {
        number = neg * number;
      }
    }
    str_local = (char *)(number * (double)p);
    if (endptr != (char **)0x0) {
      *endptr = (char *)value;
    }
  }
  return (double)str_local;
}

Assistant:

NK_API double
nk_strtod(const char *str, char **endptr)
{
    double m;
    double neg = 1.0;
    const char *p = str;
    double value = 0;
    double number = 0;

    NK_ASSERT(str);
    if (!str) return 0;

    /* skip whitespace */
    while (*p == ' ') p++;
    if (*p == '-') {
        neg = -1.0;
        p++;
    }

    while (*p && *p != '.' && *p != 'e') {
        value = value * 10.0 + (double) (*p - '0');
        p++;
    }

    if (*p == '.') {
        p++;
        for(m = 0.1; *p && *p != 'e'; p++ ) {
            value = value + (double) (*p - '0') * m;
            m *= 0.1;
        }
    }
    if (*p == 'e') {
        int i, pow, div;
        p++;
        if (*p == '-') {
            div = nk_true;
            p++;
        } else if (*p == '+') {
            div = nk_false;
            p++;
        } else div = nk_false;

        for (pow = 0; *p; p++)
            pow = pow * 10 + (int) (*p - '0');

        for (m = 1.0, i = 0; i < pow; i++)
            m *= 10.0;

        if (div)
            value /= m;
        else value *= m;
    }
    number = value * neg;
    if (endptr)
        *endptr = (char*)p;
    return number;
}